

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

bool absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<google::protobuf::Descriptor>
               (Data arg,FormatConversionSpecImpl spec,void *out)

{
  FormatConversionChar FVar1;
  bool bVar2;
  enable_if_t<_std::is_enum<Descriptor>::value_&&__std::is_same<Descriptor,_absl::Cord>::value_&&_std::is_void<decltype(AbslStringify(std::declval<FormatSink_&>(),_v))>::value,_ArgConvertResult<FormatConversionCharSetInternal::v>_>
  eVar3;
  FormatConversionCharSet set;
  Descriptor *this;
  FormatSinkImpl *in_R8;
  FormatConversionSpecImpl FVar4;
  void *out_local;
  Descriptor *local_24;
  FormatConversionSpecImpl spec_local;
  Data arg_local;
  
  spec_local._0_4_ = spec.precision_;
  local_24 = spec._0_8_;
  spec_local._4_8_ = arg;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
  if (FVar1 == (v|s)) {
    arg_local.buf[7] = ToInt<google::protobuf::Descriptor>(spec_local._4_8_,out);
  }
  else {
    set = ArgumentToConv<google::protobuf::Descriptor>();
    FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
    bVar2 = Contains(set,FVar1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this = Manager<google::protobuf::Descriptor,_(absl::lts_20250127::str_format_internal::FormatArgImpl::StoragePolicy)0>
             ::Value((Data)spec_local._4_8_);
      FVar4.width_ = 0;
      FVar4.conv_ = spec_local.conv_;
      FVar4.flags_ = spec_local.flags_;
      FVar4.length_mod_ = spec_local.length_mod_;
      FVar4._3_1_ = spec_local._3_1_;
      FVar4.precision_ = (int)out;
      eVar3 = FormatConvertImpl<google::protobuf::Descriptor>
                        ((str_format_internal *)this,local_24,FVar4,in_R8);
      arg_local.buf[7] = eVar3.value & 1;
    }
    else {
      arg_local.buf[7] = '\0';
    }
  }
  return (bool)arg_local.buf[7];
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }